

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool SparseKeyTest<56,unsigned_long>
               (hashfunc<unsigned_long> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  undefined7 in_register_00000081;
  int iVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  unsigned_long h;
  Blob<56> local_64;
  undefined4 local_5c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  unsigned_long local_38;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  local_5c = (undefined4)CONCAT71(in_register_00000081,testDist);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x38,pcVar2,(ulong)(uint)setbits);
  local_64.bytes[4] = '\0';
  local_64.bytes[5] = '\0';
  local_64.bytes[6] = '\0';
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_64.bytes[0] = '\0';
  local_64.bytes[1] = '\0';
  local_64.bytes[2] = '\0';
  local_64.bytes[3] = '\0';
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  if (iVar3 != 0) {
    (*hash.m_hash)(&local_64,7,0,&local_38);
    if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_58,
                 (iterator)
                 local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_38);
    }
    else {
      *local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = local_38;
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  SparseKeygenRecurse<Blob<56>,unsigned_long>(hash.m_hash,0,setbits,inclusive,&local_64,&local_58);
  printf("%d keys\n",
         (ulong)((long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start) >> 3);
  bVar1 = TestHashList<unsigned_long>(&local_58,drawDiagram,testColl,local_5c._0_1_,true,true);
  putchar(10);
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}